

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall
groundupdb::HashedValue::
HashedValue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (HashedValue *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *from)

{
  size_t sVar1;
  _Elt_pointer pbVar2;
  _Elt_pointer pbVar3;
  _Map_pointer local_120;
  Bytes data;
  Bytes t;
  decay_t<std::deque<std::__cxx11::basic_string<char>_>_> v;
  DefaultHash h1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_HashedValue = (_func_int **)&PTR__HashedValue_001bc828;
  this->m_has_value = true;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_length = 0;
  this->m_hash = 0;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&v,from);
  data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_120 = v.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar2 = v.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar3 = v.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  while (pbVar2 != v.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar2);
    HashedValue<std::__cxx11::string>((HashedValue *)&h1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    HashedValue::data((Bytes *)&t.super__Vector_base<std::byte,_std::allocator<std::byte>_>,
                      (HashedValue *)&h1);
    std::vector<std::byte,std::allocator<std::byte>>::
    insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&data,
               (const_iterator)
               data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>)
               t.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>)
               t.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&t.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    ~HashedValue((HashedValue *)&h1);
    pbVar2 = pbVar2 + 1;
    if (pbVar2 == pbVar3) {
      pbVar2 = local_120[1];
      local_120 = local_120 + 1;
      pbVar3 = pbVar2 + 0x10;
    }
  }
  std::vector<std::byte,std::allocator<std::byte>>::
  insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&this->m_data,
             (const_iterator)
             (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>)
             data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>)
             data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  this->m_length =
       (long)(this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&data.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  DefaultHash::DefaultHash(&h1,1,2,3,4);
  sVar1 = DefaultHash::operator()(&h1,&this->m_data);
  this->m_hash = sVar1;
  DefaultHash::~DefaultHash(&h1);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&v);
  return;
}

Assistant:

HashedValue(VT from) : m_has_value(true), m_data(), m_length(0), m_hash(0)
  {
    // first remove reference
    auto v = std::decay_t<VT>(from);
    // second check if its a basic type and convert to bytes
    if constexpr(std::is_same_v<std::string, decltype(v)>) {
      //std::cout << "DECLTYPE std::string" << std::endl;
      m_length = from.length();
      m_data.reserve(m_length);
      std::transform(from.begin(), from.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });
                     
    } else if constexpr (std::is_same_v<char *, decltype(v)>) {
      //std::cout << "DECLTYPE char ptr" << std::endl;
      std::string s(v);
      m_length = s.length();
      m_data.reserve(m_length);
      std::transform(s.begin(), s.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });

    } else if constexpr (std::is_same_v<const char*, decltype(v)>) {
      //std::cout << "DECLTYPE char array" << std::endl;
      std::string s(v);
      m_length = s.length();
      m_data.reserve(m_length);
      std::transform(s.begin(), s.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });

    } else if constexpr(std::numeric_limits<VT>::is_integer) {
      //std::cout << "DECLTYPE numeric" << std::endl;
      m_length = sizeof(v) / sizeof(std::byte);
      auto vcopy = v; // copy ready for modification
      m_data.reserve(m_length);
      for (auto i = std::size_t(0); i < m_length; i++)
      {
        // NOTE This implements little-endian conversion TODO do we want this?
        m_data.push_back(static_cast<std::byte>((vcopy & 0xFF)));
        vcopy = vcopy >> sizeof(std::byte);
      }

    } else if constexpr(std::is_floating_point_v<VT>) {
      //std::cout << "DECLTYPE float" << std::endl;
      m_length = sizeof(v) / sizeof(std::byte);
      auto vcopy = v; // copy ready for modification
      unsigned int asInt = *((int *)&vcopy);
      m_data.reserve(m_length);
      for (auto i = std::size_t(0); i < m_length; i++)
      {
        // NOTE This implements little-endian conversion TODO do we want this?
        m_data.push_back(static_cast<std::byte>((asInt & 0xFF)));
        asInt = asInt >> sizeof(std::byte);
      }

    } else if constexpr (std::is_same_v<Bytes, decltype(v)>) {
      m_length = from.size();
      m_data = std::move(from);

    } else if constexpr (is_container<decltype(v)>::value) {
      // Convert contents to EncodedValue and serialise it
      // TODO in future this will preserve its runtime type
      Bytes data; 
      // ^^^ can't reserve yet - may be dynamic type in container 
      //     (We MUST do a deep copy)
      for (auto iter = v.begin();iter != v.end();++iter) {
        HashedValue hv(*iter); 
        // ^^^ uses template functions, so a little recursion here
        Bytes t = hv.data();
        data.insert(std::end(data),t.begin(),t.end());
        // https://stackoverflow.com/questions/2551775/appending-a-vector-to-a-vector
      }
      // TODO append EncodedValue(CPP,decltype<VT>,...,data) instead
      m_data.insert(std::end(m_data),data.begin(),data.end());
      m_length = m_data.size(); // can only know after inserts
    // } else if constexpr (is_keyed_container<decltype(v)>::value) {
    //   std::cout << "DECLTYPE keyed container" << std::endl;

    
    } else if constexpr (is_keyed_container<decltype(v)>::value) {
      // Convert contents to EncodedValue and serialise it
      // TODO in future this will preserve its runtime type
      Bytes data; 
      // ^^^ can't reserve yet - may be dynamic type in container 
      //     (We MUST do a deep copy)
      for (auto iter = v.begin();iter != v.end();++iter) {
        HashedValue hv(iter->second); 
        // ^^^ uses template functions, so a little recursion here
        Bytes t = hv.data();
        data.insert(std::end(data),t.begin(),t.end());
        // https://stackoverflow.com/questions/2551775/appending-a-vector-to-a-vector
      }
      // TODO append EncodedValue(CPP,decltype<VT>,...,data) instead
      m_data.insert(std::end(m_data),data.begin(),data.end());
      m_length = m_data.size(); // can only know after inserts
      

/*
    } else if constexpr(std::is_convertible_v<decltype(v),HashedValue> && !std::is_same_v<decltype(v),HashedValue>) {
      HashedValue hv = v; // calls type cast operator - https://www.cplusplus.com/doc/tutorial/typecasting/
      m_has_value = hv.m_has_value;
      m_length = hv.m_length;
      m_data = std::move(hv.m_data);
      m_hash = hv.m_hash;
      return; // no need to recompute hash

      */
    } else {
      throw std::runtime_error(typeid(v).name());
      // TODO we don't support it, fire off a compiler warning
      //static_assert(false, "Must be a supported type, or convertible to std::vector<std::byte>!");
    }
    // TODO use correct hasher for current database connection, with correct initialisation settings
    DefaultHash h1{1, 2, 3, 4};
    m_hash = h1(m_data);
  }